

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O0

SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::create(LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,DataKey *newkey,int nonzeros,
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *newlhs,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *newrhs,
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *newobj,int *newscaleExp)

{
  int iVar1;
  int iVar2;
  cpp_dec_float<50U,_int,_void> *this_00;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  int *piVar3;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  long in_RDI;
  DataKey *in_R8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_R9;
  int *in_stack_00000008;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  DataArray<int> *in_stack_ffffffffffffff30;
  int idxmax;
  undefined1 in_stack_ffffffffffffff9b;
  
  iVar1 = num((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x32317d);
  iVar1 = iVar1 + 1;
  iVar2 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::dim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x323192);
  if (iVar2 < iVar1) {
    num((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x3231b6);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(in_R9,iVar1,(bool)in_stack_ffffffffffffff9b);
    num((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x3231e2);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(in_R9,iVar1,(bool)in_stack_ffffffffffffff9b);
    num((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x32320e);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(in_R9,iVar1,(bool)in_stack_ffffffffffffff9b);
    num((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x32323a);
    DataArray<int>::reSize(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  }
  this_00 = (cpp_dec_float<50U,_int,_void> *)(in_RDI + 0x68);
  num((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x32326c);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)this_00,in_stack_ffffffffffffff2c);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (this_00,(cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  idxmax = (int)((ulong)(in_RDI + 0x80) >> 0x20);
  num((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x3232ca);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)this_00,in_stack_ffffffffffffff2c);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (this_00,(cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  this_01 = (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)(in_RDI + 0x98);
  num((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x323325);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)this_00,in_stack_ffffffffffffff2c);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (this_00,(cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  iVar1 = *in_stack_00000008;
  iVar2 = num((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x323384);
  piVar3 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0xb0),iVar2);
  *piVar3 = iVar1;
  pSVar4 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::create(this_01,in_R8,idxmax);
  return pSVar4;
}

Assistant:

SVectorBase<R>& create(DataKey& newkey, int nonzeros = 0, const R& newlhs = 0, const R& newrhs = 1,
                          const R& newobj = 0, const int& newscaleExp = 0)
   {
      if(num() + 1 > left.dim())
      {
         left.reDim(num() + 1);
         right.reDim(num() + 1);
         object.reDim(num() + 1);
         scaleExp.reSize(num() + 1);
      }

      left[num()] = newlhs;
      right[num()] = newrhs;
      object[num()] = newobj;
      scaleExp[num()] = newscaleExp;

      return *SVSetBase<R>::create(newkey, nonzeros);
   }